

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsTypesX.hpp
# Opt level: O2

void __thiscall
Diligent::
PipelineStateCreateInfoX<Diligent::ComputePipelineStateCreateInfoX,_Diligent::ComputePipelineStateCreateInfo>
::PipelineStateCreateInfoX
          (PipelineStateCreateInfoX<Diligent::ComputePipelineStateCreateInfoX,_Diligent::ComputePipelineStateCreateInfo>
           *this,PipelineStateCreateInfoX<Diligent::ComputePipelineStateCreateInfoX,_Diligent::ComputePipelineStateCreateInfo>
                 *param_1)

{
  pointer pRVar1;
  pointer ppIVar2;
  long lVar3;
  PipelineStateCreateInfoX<Diligent::ComputePipelineStateCreateInfoX,_Diligent::ComputePipelineStateCreateInfo>
  *pPVar4;
  PipelineStateCreateInfoX<Diligent::ComputePipelineStateCreateInfoX,_Diligent::ComputePipelineStateCreateInfo>
  *pPVar5;
  
  pPVar4 = param_1;
  pPVar5 = this;
  for (lVar3 = 0xd; lVar3 != 0; lVar3 = lVar3 + -1) {
    (pPVar5->super_ComputePipelineStateCreateInfo).super_PipelineStateCreateInfo.PSODesc.
    super_DeviceObjectAttribs.Name =
         (pPVar4->super_ComputePipelineStateCreateInfo).super_PipelineStateCreateInfo.PSODesc.
         super_DeviceObjectAttribs.Name;
    pPVar4 = (PipelineStateCreateInfoX<Diligent::ComputePipelineStateCreateInfoX,_Diligent::ComputePipelineStateCreateInfo>
              *)&(pPVar4->super_ComputePipelineStateCreateInfo).super_PipelineStateCreateInfo.
                 PSODesc.PipelineType;
    pPVar5 = (PipelineStateCreateInfoX<Diligent::ComputePipelineStateCreateInfoX,_Diligent::ComputePipelineStateCreateInfo>
              *)&(pPVar5->super_ComputePipelineStateCreateInfo).super_PipelineStateCreateInfo.
                 PSODesc.PipelineType;
  }
  PipelineResourceLayoutDescX::PipelineResourceLayoutDescX
            (&this->ResourceLayout,&param_1->ResourceLayout);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::_Hashtable(&(this->StringPool)._M_h,&(param_1->StringPool)._M_h);
  pRVar1 = (param_1->Objects).
           super__Vector_base<Diligent::RefCntAutoPtr<Diligent::IDeviceObject>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IDeviceObject>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  (this->Objects).
  super__Vector_base<Diligent::RefCntAutoPtr<Diligent::IDeviceObject>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IDeviceObject>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (param_1->Objects).
       super__Vector_base<Diligent::RefCntAutoPtr<Diligent::IDeviceObject>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IDeviceObject>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->Objects).
  super__Vector_base<Diligent::RefCntAutoPtr<Diligent::IDeviceObject>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IDeviceObject>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = pRVar1;
  (this->Objects).
  super__Vector_base<Diligent::RefCntAutoPtr<Diligent::IDeviceObject>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IDeviceObject>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (param_1->Objects).
       super__Vector_base<Diligent::RefCntAutoPtr<Diligent::IDeviceObject>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IDeviceObject>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (param_1->Objects).
  super__Vector_base<Diligent::RefCntAutoPtr<Diligent::IDeviceObject>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IDeviceObject>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (param_1->Objects).
  super__Vector_base<Diligent::RefCntAutoPtr<Diligent::IDeviceObject>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IDeviceObject>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (param_1->Objects).
  super__Vector_base<Diligent::RefCntAutoPtr<Diligent::IDeviceObject>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IDeviceObject>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ppIVar2 = (param_1->Signatures).
            super__Vector_base<Diligent::IPipelineResourceSignature_*,_std::allocator<Diligent::IPipelineResourceSignature_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  (this->Signatures).
  super__Vector_base<Diligent::IPipelineResourceSignature_*,_std::allocator<Diligent::IPipelineResourceSignature_*>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (param_1->Signatures).
       super__Vector_base<Diligent::IPipelineResourceSignature_*,_std::allocator<Diligent::IPipelineResourceSignature_*>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->Signatures).
  super__Vector_base<Diligent::IPipelineResourceSignature_*,_std::allocator<Diligent::IPipelineResourceSignature_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = ppIVar2;
  (this->Signatures).
  super__Vector_base<Diligent::IPipelineResourceSignature_*,_std::allocator<Diligent::IPipelineResourceSignature_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (param_1->Signatures).
       super__Vector_base<Diligent::IPipelineResourceSignature_*,_std::allocator<Diligent::IPipelineResourceSignature_*>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (param_1->Signatures).
  super__Vector_base<Diligent::IPipelineResourceSignature_*,_std::allocator<Diligent::IPipelineResourceSignature_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (param_1->Signatures).
  super__Vector_base<Diligent::IPipelineResourceSignature_*,_std::allocator<Diligent::IPipelineResourceSignature_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (param_1->Signatures).
  super__Vector_base<Diligent::IPipelineResourceSignature_*,_std::allocator<Diligent::IPipelineResourceSignature_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->InternalData)._M_t.
  super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
  super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
       (param_1->InternalData)._M_t.
       super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
       super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
       super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
  (param_1->InternalData)._M_t.
  super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
  super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl = (uchar *)0x0;
  return;
}

Assistant:

PipelineStateCreateInfoX(PipelineStateCreateInfoX&&) noexcept = default;